

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugTools.h
# Opt level: O0

bool cm::anon_unknown_0::dbg_impl<bool>(char *fname,int line,char *expr,bool value)

{
  bool bVar1;
  ostream *poVar2;
  void *this;
  allocator<char> local_71;
  string local_70;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  byte local_21;
  char *pcStack_20;
  bool value_local;
  char *expr_local;
  char *pcStack_10;
  int line_local;
  char *fname_local;
  
  local_21 = value;
  pcStack_20 = expr;
  expr_local._4_4_ = line;
  pcStack_10 = fname;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"CMAKE_NO_DBG",&local_71);
  cmSystemTools::GetEnvVar(&local_50,&local_70);
  bVar1 = std::optional::operator_cast_to_bool((optional *)&local_50);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,pcStack_10);
    poVar2 = std::operator<<(poVar2,':');
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,expr_local._4_4_);
    poVar2 = std::operator<<(poVar2,": ");
    poVar2 = std::operator<<(poVar2,pcStack_20);
    poVar2 = std::operator<<(poVar2," = ");
    this = (void *)std::ostream::operator<<(poVar2,(bool)(local_21 & 1));
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  return (bool)(local_21 & 1);
}

Assistant:

T dbg_impl(const char* fname, int line, const char* expr, T value)
{
  if (!cmSystemTools::GetEnvVar("CMAKE_NO_DBG")) {
    std::cerr << fname << ':' << line << ": " << expr << " = " << value
              << std::endl;
  }
  return value;
}